

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void igPushClipRect(ImVec2 clip_rect_min,ImVec2 clip_rect_max,bool intersect_with_current_clip_rect)

{
  ImVec2 IStack_18;
  bool intersect_with_current_clip_rect_local;
  ImVec2 clip_rect_max_local;
  ImVec2 clip_rect_min_local;
  
  IStack_18 = clip_rect_max;
  clip_rect_max_local = clip_rect_min;
  ImGui::PushClipRect(&clip_rect_max_local,&stack0xffffffffffffffe8,intersect_with_current_clip_rect
                     );
  return;
}

Assistant:

CIMGUI_API void _igPushClipRect (ImVec2 const *larg1, ImVec2 const *larg2, int larg3) {
  ImVec2 arg1 ;
  ImVec2 arg2 ;
  bool arg3 ;
  
  arg1 = *larg1;
  arg2 = *larg2;
  arg3 = (bool)larg3;
  try {
    igPushClipRect(arg1,arg2,arg3);
    
  } catch (...) {
    
  }
}